

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O0

void __thiscall
unitNameDefinitions_combinedDuplicates_Test::unitNameDefinitions_combinedDuplicates_Test
          (unitNameDefinitions_combinedDuplicates_Test *this)

{
  unitNameDefinitions_combinedDuplicates_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__unitNameDefinitions_combinedDuplicates_Test_001b1fe8;
  return;
}

Assistant:

TEST(unitNameDefinitions, combinedDuplicates)
{
    std::unordered_map<units::unit, std::string> testMap;
    for (const auto& ustring : units::defined_unit_names_si) {
        if (ustring.second == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second)
            << "duplicate si unit string " << ustring.second;
    }

    for (std::size_t ii = 0; ii < units::defined_unit_names_customary.size();
         ++ii) {
        if (units::defined_unit_names_customary[ii].second == nullptr) {
            continue;
        }
        auto res = testMap.emplace(
            units::defined_unit_names_customary[ii].first,
            units::defined_unit_names_customary[ii].second);
        EXPECT_TRUE(res.second)
            << "duplicate unit string " << ii << " "
            << units::defined_unit_names_customary[ii].second;
    }
}